

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::compiler::Compiler::Node_*> * __thiscall
kj::ArrayBuilder<capnp::compiler::Compiler::Node_*>::operator=
          (ArrayBuilder<capnp::compiler::Compiler::Node_*> *this,
          ArrayBuilder<capnp::compiler::Compiler::Node_*> *other)

{
  RemoveConst<capnp::compiler::Compiler::Node_*> *ppNVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  ppNVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppNVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Node **)0x0;
  other->pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  other->endPtr = (Node **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }